

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O1

longlong MercuryJson::parse_number(char *input,bool *is_decimal,size_t offset)

{
  char *pcVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  undefined1 *puVar9;
  longlong lVar10;
  bool bVar11;
  bool bVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar30 [16];
  undefined8 in_XMM9_Qb;
  string local_70;
  char *local_50;
  double local_48;
  
  pcVar1 = input + offset;
  cVar3 = input[offset];
  pauVar14 = (undefined1 (*) [16])(pcVar1 + (cVar3 == '-'));
  local_50 = input;
  if (pcVar1[cVar3 == '-'] == '0') {
    if ((byte)((*pauVar14)[1] - 0x30) < 10) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"numbers cannot have leading zeros","");
      __error(&local_70,local_50,offset);
    }
    pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
    lVar15 = 0;
  }
  else {
    if ((byte)(pcVar1[cVar3 == '-'] - 0x3aU) < 0xf6) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"numbers must have integer parts","");
      __error(&local_70,local_50,offset);
    }
    uVar2 = *(undefined8 *)*pauVar14;
    lVar19 = psubusb(CONCAT17((char)((ulong)uVar2 >> 0x38) + -0x30,
                              CONCAT16((char)((ulong)uVar2 >> 0x30) + -0x30,
                                       CONCAT15((char)((ulong)uVar2 >> 0x28) + -0x30,
                                                CONCAT14((char)((ulong)uVar2 >> 0x20) + -0x30,
                                                         CONCAT13((char)((ulong)uVar2 >> 0x18) +
                                                                  -0x30,CONCAT12((char)((ulong)uVar2
                                                                                       >> 0x10) +
                                                                                 -0x30,CONCAT11((
                                                  char)((ulong)uVar2 >> 8) + -0x30,
                                                  (char)uVar2 + -0x30))))))),0x909090909090909);
    lVar15 = 0;
    if (lVar19 == 0) {
      auVar17[8] = 0xd0;
      auVar17._0_8_ = 0xd0d0d0d0d0d0d0d0;
      auVar17[9] = 0xd0;
      auVar17[10] = 0xd0;
      auVar17[0xb] = 0xd0;
      auVar17[0xc] = 0xd0;
      auVar17[0xd] = 0xd0;
      auVar17[0xe] = 0xd0;
      auVar17[0xf] = 0xd0;
      auVar18._8_2_ = 0x10a;
      auVar18._0_8_ = 0x10a010a010a010a;
      auVar18._10_2_ = 0x10a;
      auVar18._12_2_ = 0x10a;
      auVar18._14_2_ = 0x10a;
      auVar24._8_4_ = 0x10064;
      auVar24._0_8_ = 0x1006400010064;
      auVar24._12_4_ = 0x10064;
      do {
        auVar21 = vpaddb_avx(auVar17,*pauVar14);
        auVar21 = vpmaddubsw_avx(auVar21,auVar18);
        auVar21 = vpmaddwd_avx(auVar21,auVar24);
        auVar21 = vpackusdw_avx(auVar21,auVar21);
        auVar21 = vpmaddwd_avx(auVar21,SUB6416(ZEXT464(0x12710),0));
        lVar15 = CONCAT44((int)((ulong)lVar15 >> 0x20),auVar21._0_4_) + lVar15 * 100000000;
        uVar2 = *(undefined8 *)(*pauVar14 + 8);
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
        lVar19 = psubusb(CONCAT17((char)((ulong)uVar2 >> 0x38) + -0x30,
                                  CONCAT16((char)((ulong)uVar2 >> 0x30) + -0x30,
                                           CONCAT15((char)((ulong)uVar2 >> 0x28) + -0x30,
                                                    CONCAT14((char)((ulong)uVar2 >> 0x20) + -0x30,
                                                             CONCAT13((char)((ulong)uVar2 >> 0x18) +
                                                                      -0x30,CONCAT12((char)((ulong)
                                                  uVar2 >> 0x10) + -0x30,
                                                  (short)CONCAT71((int7)((ulong)uVar2 >> 8),
                                                                  (char)uVar2 + -0x30))))))),
                         0x909090909090909);
      } while (lVar19 == 0);
    }
    cVar4 = (*pauVar14)[0];
    while ((byte)(cVar4 - 0x30U) < 10) {
      lVar15 = (ulong)(byte)(cVar4 - 0x30) + lVar15 * 10;
      puVar8 = *pauVar14;
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
      cVar4 = puVar8[1];
    }
  }
  if ((ulong)((long)pauVar14 - (long)pcVar1) < 0x13) {
    if ((*pauVar14)[0] == '.') {
      auVar22 = ZEXT1664(CONCAT88(in_XMM5_Qa,(double)lVar15));
      uVar2 = *(undefined8 *)(*pauVar14 + 1);
      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
      lVar19 = psubusb(CONCAT17((char)((ulong)uVar2 >> 0x38) + -0x30,
                                CONCAT16((char)((ulong)uVar2 >> 0x30) + -0x30,
                                         CONCAT15((char)((ulong)uVar2 >> 0x28) + -0x30,
                                                  CONCAT14((char)((ulong)uVar2 >> 0x20) + -0x30,
                                                           CONCAT13((char)((ulong)uVar2 >> 0x18) +
                                                                    -0x30,CONCAT12((char)((ulong)
                                                  uVar2 >> 0x10) + -0x30,
                                                  CONCAT11((char)((ulong)uVar2 >> 8) + -0x30,
                                                           (char)uVar2 + -0x30))))))),
                       0x909090909090909);
      auVar23 = ZEXT1664(ZEXT816(0x3fb999999999999a));
      if (lVar19 == 0) {
        auVar25[8] = 0xd0;
        auVar25._0_8_ = 0xd0d0d0d0d0d0d0d0;
        auVar25[9] = 0xd0;
        auVar25[10] = 0xd0;
        auVar25[0xb] = 0xd0;
        auVar25[0xc] = 0xd0;
        auVar25[0xd] = 0xd0;
        auVar25[0xe] = 0xd0;
        auVar25[0xf] = 0xd0;
        auVar27._8_2_ = 0x10a;
        auVar27._0_8_ = 0x10a010a010a010a;
        auVar27._10_2_ = 0x10a;
        auVar27._12_2_ = 0x10a;
        auVar27._14_2_ = 0x10a;
        auVar29._8_4_ = 0x10064;
        auVar29._0_8_ = 0x1006400010064;
        auVar29._12_4_ = 0x10064;
        do {
          auVar17 = vpaddb_avx(auVar25,*pauVar14);
          auVar17 = vpmaddubsw_avx(auVar17,auVar27);
          auVar17 = vpmaddwd_avx(auVar17,auVar29);
          auVar17 = vpackusdw_avx(auVar17,auVar17);
          auVar17 = vpmaddwd_avx(auVar17,SUB6416(ZEXT464(0x12710),0));
          auVar17 = vcvtudq2pd_avx512vl(auVar17);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = auVar17._0_8_ * auVar23._0_8_;
          auVar17 = vfmadd231sd_fma(auVar22._0_16_,auVar30,ZEXT816(0x3e7ad7f29abcaf48));
          auVar22 = ZEXT1664(auVar17);
          auVar23 = ZEXT864((ulong)(auVar23._0_8_ * 1e-08));
          uVar2 = *(undefined8 *)(*pauVar14 + 8);
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
          lVar19 = psubusb(CONCAT17((char)((ulong)uVar2 >> 0x38) + -0x30,
                                    CONCAT16((char)((ulong)uVar2 >> 0x30) + -0x30,
                                             CONCAT15((char)((ulong)uVar2 >> 0x28) + -0x30,
                                                      CONCAT14((char)((ulong)uVar2 >> 0x20) + -0x30,
                                                               CONCAT13((char)((ulong)uVar2 >> 0x18)
                                                                        + -0x30,CONCAT12((char)((
                                                  ulong)uVar2 >> 0x10) + -0x30,
                                                  (short)CONCAT71((int7)((ulong)uVar2 >> 8),
                                                                  (char)uVar2 + -0x30))))))),
                           0x909090909090909);
        } while (lVar19 == 0);
      }
      auVar21 = auVar22._0_16_;
      dVar20 = auVar23._0_8_;
      cVar4 = (*pauVar14)[0];
      while ((byte)(cVar4 - 0x30U) < 10) {
        auVar28._0_8_ = (double)(byte)(cVar4 - 0x30);
        auVar28._8_8_ = in_XMM9_Qb;
        auVar21 = vfmadd231sd_fma(auVar22._0_16_,auVar23._0_16_,auVar28);
        auVar22 = ZEXT1664(auVar21);
        dVar20 = auVar23._0_8_ * 0.1;
        auVar23 = ZEXT864((ulong)dVar20);
        puVar8 = *pauVar14;
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
        cVar4 = puVar8[1];
      }
      bVar12 = true;
      if ((dVar20 == 0.1) && (!NAN(dVar20))) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"excessive characters at end of number","");
        __error(&local_70,local_50,(size_t)(*pauVar14 + ~(ulong)local_50));
      }
    }
    else {
      auVar21 = (undefined1  [16])0x0;
      bVar12 = false;
    }
    if (((*pauVar14)[0] | 0x20) == 0x65) {
      bVar11 = true;
      if (bVar12 != false) {
        bVar11 = bVar12;
      }
      cVar4 = (*pauVar14)[1];
      bVar16 = (cVar4 - 0x2bU & 0xfd) == 0;
      pauVar13 = (undefined1 (*) [16])(*pauVar14 + 1);
      if (bVar16) {
        pauVar13 = (undefined1 (*) [16])(*pauVar14 + 2);
      }
      if ((byte)((*pauVar14)[(ulong)bVar16 + 1] - 0x3a) < 0xf6) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"numbers must not have null exponents","");
        __error(&local_70,local_50,(long)pauVar13 - (long)local_50);
      }
      local_48 = (double)((ulong)bVar12 * auVar21._0_8_ + (ulong)!bVar12 * (long)(double)lVar15);
      auVar17 = ZEXT816(0) << 0x40;
      do {
        puVar8 = *pauVar13;
        puVar9 = *pauVar13;
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + 1);
        auVar26._0_8_ = (double)((char)*puVar8 + -0x30);
        auVar26._8_8_ = in_XMM9_Qb;
        auVar17 = vfmadd132sd_fma(auVar17,auVar26,ZEXT816(0x4024000000000000));
      } while ((byte)(puVar9[1] - 0x30) < 10);
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar18 = vandpd_avx512vl(auVar17,auVar5);
      if (308.0 < auVar18._0_8_) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"decimal exponent out of range","");
        __error(&local_70,local_50,offset);
      }
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar18 = vxorpd_avx512vl(auVar17,auVar6);
      dVar20 = pow(10.0,(double)((ulong)(cVar4 == '-') * auVar18._0_8_ +
                                (ulong)(cVar4 != '-') * auVar17._0_8_));
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar20 * local_48;
      pauVar14 = pauVar13;
      bVar12 = bVar11;
    }
    dVar20 = auVar21._0_8_;
    if (*(long *)(kStructuralOrWhitespace + (long)(char)(*pauVar14)[0] * 8) == 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"excessive characters at end of number","");
      __error(&local_70,local_50,(long)pauVar14 - (long)local_50);
    }
    *is_decimal = bVar12;
    if (cVar3 == '-') {
      if (bVar12 == false) {
        return -lVar15;
      }
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar21,auVar7);
      dVar20 = auVar17._0_8_;
    }
    else if (bVar12 == false) {
      return lVar15;
    }
    lVar10 = plain_convert(dVar20);
    return lVar10;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"integer part too large","");
  __error(&local_70,local_50,offset);
}

Assistant:

long long int parse_number(const char *input, bool *is_decimal, size_t offset) {
#if NO_PARSE_NUMBER
        *is_decimal = false;
        return 0LL;
#endif
        const char *s = input + offset;
        long long int integer = 0LL;
        double decimal = 0.0;
        bool negative = false, _is_decimal = false;
        if (*s == '-') {
            ++s;
            negative = true;
        }
        if (*s == '0') {
            ++s;
            if (*s >= '0' && *s <= '9')
                __error("numbers cannot have leading zeros", input, offset);
        } else {
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must have integer parts", input, offset);
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                integer = integer * 100000000 + _parse_eight_digits(s);
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9')
                integer = integer * 10 + (*s++ - '0');
        }
        if (s - input - offset > 18)
            __error("integer part too large", input, offset);
        if (*s == '.') {
            _is_decimal = true;
            decimal = integer;
            double multiplier = 0.1;
            ++s;
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                decimal += _parse_eight_digits(s) * multiplier * 0.0000001;  // 7 digits
                multiplier *= 0.00000001;  // 8 digits
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9') {
                decimal += (*s++ - '0') * multiplier;
                multiplier *= 0.1;
            }if (multiplier == 0.1)
                __error("excessive characters at end of number", input, s - input - 1);
        }
        if (*s == 'e' || *s == 'E') {
            if (!_is_decimal) {
                _is_decimal = true;
                decimal = integer;
            }
            ++s;
            bool negative_exp = false;
            if (*s == '-') {
                negative_exp = true;
                ++s;
            } else if (*s == '+') ++s;
            double exponent = 0.0;
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must not have null exponents", input, s - input);
            do {
                exponent = exponent * 10.0 + (*s++ - '0');
            } while (*s >= '0' && *s <= '9');
            if (negative_exp) exponent = -exponent;
            if (exponent < -308 || exponent > 308)
                __error("decimal exponent out of range", input, offset);
            decimal *= pow(10.0, exponent);
        }
        if (!kStructuralOrWhitespace[*s])
            __error("excessive characters at end of number", input, s - input);
        *is_decimal = _is_decimal;
        if (negative) {
            if (_is_decimal) return plain_convert(-decimal);
            else return -integer;
        } else {
            if (_is_decimal) return plain_convert(decimal);
            else return integer;
        }
    }